

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ReactiveDevice.cpp
# Opt level: O1

void __thiscall
Apple::ADB::ReactiveDevice::adb_bus_did_observe_event
          (ReactiveDevice *this,Event event,uint8_t value)

{
  pointer *ppuVar1;
  ushort uVar2;
  int iVar3;
  iterator __position;
  ushort *puVar4;
  pointer puVar5;
  byte bVar6;
  byte bVar7;
  undefined2 uVar8;
  uint uVar9;
  ulong uVar10;
  Type TVar11;
  initializer_list<unsigned_char> __l;
  byte local_2c;
  allocator_type local_2b;
  ushort local_2a;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_28;
  
  if (this->phase_ == AwaitingAttention) {
    if (event != Attention) {
      return;
    }
    this->phase_ = AwaitingCommand;
    return;
  }
  if (event != Byte) {
    return;
  }
  local_2c = value;
  if (this->phase_ == AwaitingContent) {
    __position._M_current =
         (this->content_).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
         super__Vector_impl_data._M_finish;
    if (__position._M_current ==
        (this->content_).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      std::vector<unsigned_char,std::allocator<unsigned_char>>::
      _M_realloc_insert<unsigned_char_const&>
                ((vector<unsigned_char,std::allocator<unsigned_char>> *)&this->content_,__position,
                 &local_2c);
    }
    else {
      *__position._M_current = value;
      ppuVar1 = &(this->content_).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                 _M_impl.super__Vector_impl_data._M_finish;
      *ppuVar1 = *ppuVar1 + 1;
    }
    puVar4 = (ushort *)
             (this->content_).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
             _M_impl.super__Vector_impl_data._M_start;
    if ((long)(this->content_).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
              _M_impl.super__Vector_impl_data._M_finish - (long)puVar4 ==
        this->expected_content_size_) {
      this->phase_ = AwaitingAttention;
      if ((this->command_).reg == '\x03') {
        uVar2 = *puVar4;
        this->register3_ = uVar2 << 8 | uVar2 >> 8;
      }
      else {
        (*(this->super_Device)._vptr_Device[3])(this,&this->command_,&this->content_);
      }
      puVar5 = (this->content_).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
               _M_impl.super__Vector_impl_data._M_start;
      if ((this->content_).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
          .super__Vector_impl_data._M_finish != puVar5) {
        (this->content_).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_finish = puVar5;
      }
    }
  }
  if (this->phase_ != AwaitingCommand) {
    return;
  }
  this->phase_ = AwaitingAttention;
  TVar11 = Reserved;
  bVar6 = 0xff;
  switch(local_2c & 0xf) {
  case 0:
    TVar11 = Reset;
  default:
    bVar7 = 0xff;
    goto LAB_0026ac55;
  case 1:
    bVar7 = local_2c >> 4;
    TVar11 = Flush;
    goto LAB_0026ac55;
  case 8:
  case 9:
  case 10:
  case 0xb:
    TVar11 = Listen;
    break;
  case 0xc:
  case 0xd:
  case 0xe:
  case 0xf:
    TVar11 = Talk;
  }
  bVar7 = local_2c >> 4;
  bVar6 = local_2c & 3;
LAB_0026ac55:
  uVar10 = (ulong)bVar7 << 0x20 | (ulong)bVar6 << 0x28;
  (this->command_).type = TVar11;
  uVar8 = (undefined2)(uVar10 >> 0x20);
  (this->command_).device = (char)uVar8;
  (this->command_).reg = (char)((ushort)uVar8 >> 8);
  uVar9 = (uint)(uVar10 >> 0x20) & 0xff;
  if ((uVar9 == 0xff) || ((*(byte *)((long)&this->register3_ + 1) & 0xf) == (ushort)uVar9)) {
    TVar11 = (this->command_).type;
    if (TVar11 - Listen < 2) {
      if ((this->command_).reg == '\x03') {
        if (TVar11 != Talk) {
          puVar5 = (this->content_).
                   super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                   super__Vector_impl_data._M_start;
          if ((this->content_).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
              _M_impl.super__Vector_impl_data._M_finish != puVar5) {
            (this->content_).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
            _M_impl.super__Vector_impl_data._M_finish = puVar5;
          }
          this->expected_content_size_ = 2;
          this->phase_ = AwaitingContent;
          return;
        }
        local_2a = this->register3_ << 8 | this->register3_ >> 8;
        __l._M_len = 2;
        __l._M_array = (iterator)&local_2a;
        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector(&local_28,__l,&local_2b);
        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator=
                  (&this->response_,&local_28);
        this->microseconds_at_bit_ = 0.0;
        this->bit_offset_ = -2;
        if (local_28.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
            super__Vector_impl_data._M_start == (pointer)0x0) {
          return;
        }
        operator_delete(local_28.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                        _M_impl.super__Vector_impl_data._M_start,
                        (long)local_28.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_28.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_start);
        return;
      }
      LOCK();
      (this->service_desired_)._M_base._M_i = false;
      UNLOCK();
    }
    else if (TVar11 == Reset) {
      iVar3._0_1_ = this->default_adb_device_id_;
      iVar3._1_1_ = this->service_desired_;
      iVar3._2_2_ = *(undefined2 *)&this->field_0x76;
      this->register3_ = (ushort)(iVar3 << 8) | 0x6001;
    }
    (*(this->super_Device)._vptr_Device[2])(this);
  }
  else if (((this->service_desired_)._M_base._M_i & 1U) != 0) {
    LOCK();
    (this->service_desired_)._M_base._M_i = false;
    UNLOCK();
    this->stop_has_begin_ = false;
    this->phase_ = ServiceRequestPending;
    this->microseconds_at_bit_ = 0.0;
  }
  return;
}

Assistant:

void ReactiveDevice::adb_bus_did_observe_event(Bus::Event event, uint8_t value) {
	if(phase_ == Phase::AwaitingAttention) {
		if(event != Bus::Event::Attention) return;
		phase_ = Phase::AwaitingCommand;
		return;
	}

	if(event != Bus::Event::Byte) return;

	if(phase_ == Phase::AwaitingContent) {
		content_.push_back(value);
		if(content_.size() == expected_content_size_) {
			phase_ = Phase::AwaitingAttention;

			if(command_.reg == 3) {
				register3_ = uint16_t((content_[0] << 8) | content_[1]);
			} else {
				did_receive_data(command_, content_);
			}
			content_.clear();
		}
	}

	if(phase_ == Phase::AwaitingCommand) {
		phase_ = Phase::AwaitingAttention;

		command_ = decode_command(value);
//		logger.info().append("%d", command_);

		// If this command doesn't apply here, but a service request is requested,
		// post a service request.
		if(command_.device != Command::AllDevices && command_.device != ((register3_ >> 8) & 0xf)) {
			if(service_desired_) {
				service_desired_ = false;
				stop_has_begin_ = false;
				phase_ = Phase::ServiceRequestPending;
				microseconds_at_bit_ = 0.0;
			}
			return;
		}

		// Handle reset and register 3 here automatically; pass everything else along.
		switch(command_.type) {
			case Command::Type::Reset:
				reset();
			[[fallthrough]];
			default:
				perform_command(command_);
			break;

			case Command::Type::Listen:
			case Command::Type::Talk:
				if(command_.reg == 3) {
					if(command_.type == Command::Type::Talk) {
						post_response({uint8_t(register3_ >> 8), uint8_t(register3_ & 0xff)});
					} else {
						receive_bytes(2);
					}
				} else {
					service_desired_ = false;
					perform_command(command_);
				}
			break;
		}
	}
}